

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3Realloc(void *pOld,int nBytes)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int nByte;
  
  if (pOld == (void *)0x0) {
    pvVar3 = sqlite3Malloc(nBytes);
    return pvVar3;
  }
  if (nBytes < 1) {
    sqlite3_free(pOld);
  }
  else if (nBytes < 0x7fffff00) {
    iVar1 = (*sqlite3Config.m.xSize)(pOld);
    iVar2 = (*sqlite3Config.m.xRoundup)(nBytes);
    nByte = iVar2 - iVar1;
    if (nByte == 0) {
      return pOld;
    }
    if (sqlite3Config.bMemstat != 0) {
      if (mem0.mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
      }
      if (sqlite3Stat.mxValue[5] < nBytes) {
        sqlite3Stat.mxValue[5] = nBytes;
      }
      sqlite3Stat.nowValue[5] = nBytes;
      if (mem0.alarmThreshold - nByte <= (long)sqlite3Stat.nowValue[0]) {
        sqlite3MallocAlarm(nByte);
      }
      pvVar3 = (*sqlite3Config.m.xRealloc)(pOld,iVar2);
      if ((pvVar3 == (void *)0x0) &&
         (mem0.alarmCallback != (_func_void_void_ptr_sqlite3_int64_int *)0x0)) {
        sqlite3MallocAlarm(nBytes);
        pvVar3 = (*sqlite3Config.m.xRealloc)(pOld,iVar2);
      }
      if (pvVar3 != (void *)0x0) {
        iVar2 = (*sqlite3Config.m.xSize)(pvVar3);
        sqlite3Stat.nowValue[0] = (iVar2 - iVar1) + sqlite3Stat.nowValue[0];
        if (sqlite3Stat.mxValue[0] < sqlite3Stat.nowValue[0]) {
          sqlite3Stat.mxValue[0] = sqlite3Stat.nowValue[0];
        }
      }
      if (mem0.mutex == (sqlite3_mutex *)0x0) {
        return pvVar3;
      }
      (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
      return pvVar3;
    }
    pvVar3 = (*sqlite3Config.m.xRealloc)(pOld,iVar2);
    return pvVar3;
  }
  return (void *)0x0;
}

Assistant:

SQLITE_PRIVATE void *sqlite3Realloc(void *pOld, int nBytes){
  int nOld, nNew, nDiff;
  void *pNew;
  if( pOld==0 ){
    return sqlite3Malloc(nBytes); /* IMP: R-28354-25769 */
  }
  if( nBytes<=0 ){
    sqlite3_free(pOld); /* IMP: R-31593-10574 */
    return 0;
  }
  if( nBytes>=0x7fffff00 ){
    /* The 0x7ffff00 limit term is explained in comments on sqlite3Malloc() */
    return 0;
  }
  nOld = sqlite3MallocSize(pOld);
  /* IMPLEMENTATION-OF: R-46199-30249 SQLite guarantees that the second
  ** argument to xRealloc is always a value returned by a prior call to
  ** xRoundup. */
  nNew = sqlite3GlobalConfig.m.xRoundup(nBytes);
  if( nOld==nNew ){
    pNew = pOld;
  }else if( sqlite3GlobalConfig.bMemstat ){
    sqlite3_mutex_enter(mem0.mutex);
    sqlite3StatusSet(SQLITE_STATUS_MALLOC_SIZE, nBytes);
    nDiff = nNew - nOld;
    if( sqlite3StatusValue(SQLITE_STATUS_MEMORY_USED) >= 
          mem0.alarmThreshold-nDiff ){
      sqlite3MallocAlarm(nDiff);
    }
    assert( sqlite3MemdebugHasType(pOld, MEMTYPE_HEAP) );
    assert( sqlite3MemdebugNoType(pOld, ~MEMTYPE_HEAP) );
    pNew = sqlite3GlobalConfig.m.xRealloc(pOld, nNew);
    if( pNew==0 && mem0.alarmCallback ){
      sqlite3MallocAlarm(nBytes);
      pNew = sqlite3GlobalConfig.m.xRealloc(pOld, nNew);
    }
    if( pNew ){
      nNew = sqlite3MallocSize(pNew);
      sqlite3StatusAdd(SQLITE_STATUS_MEMORY_USED, nNew-nOld);
    }
    sqlite3_mutex_leave(mem0.mutex);
  }else{
    pNew = sqlite3GlobalConfig.m.xRealloc(pOld, nNew);
  }
  assert( EIGHT_BYTE_ALIGNMENT(pNew) ); /* IMP: R-04675-44850 */
  return pNew;
}